

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O3

void __thiscall SerialTaskRunner::MaybeScheduleProcessQueue(SerialTaskRunner *this)

{
  _List_node_base *p_Var1;
  CScheduler *this_00;
  Function f;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 uVar2;
  code *pcVar3;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_callbacks_mutex).super_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  if (this->m_are_callbacks_running == true) {
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  else {
    p_Var1 = (this->m_callbacks_pending).
             super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    if (p_Var1 != (_List_node_base *)&this->m_callbacks_pending) {
      this_00 = this->m_scheduler;
      uVar2 = (_Manager_type)0x0;
      pcVar3 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp:142:26)>
               ::_M_manager;
      std::chrono::_V2::steady_clock::now();
      f.super__Function_base._M_functor._8_8_ = this;
      f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffffa8;
      f.super__Function_base._M_manager = (_Manager_type)uVar2;
      f._M_invoker = pcVar3;
      CScheduler::schedule(this_00,f,(time_point)&stack0xffffffffffffffb0);
      if (pcVar3 != (_Invoker_type)0x0) {
        (*pcVar3)((_Any_data *)&stack0xffffffffffffffb0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::MaybeScheduleProcessQueue()
{
    {
        LOCK(m_callbacks_mutex);
        // Try to avoid scheduling too many copies here, but if we
        // accidentally have two ProcessQueue's scheduled at once its
        // not a big deal.
        if (m_are_callbacks_running) return;
        if (m_callbacks_pending.empty()) return;
    }
    m_scheduler.schedule([this] { this->ProcessQueue(); }, std::chrono::steady_clock::now());
}